

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

void __thiscall duckdb::LocalSortState::SortInMemory(LocalSortState *this)

{
  BufferManager *buffer_manager;
  uchar *puVar1;
  long lVar2;
  byte bVar3;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_01;
  bool bVar4;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> _Var5;
  const_reference cVar6;
  int iVar7;
  int iVar8;
  reference this_00;
  reference pvVar9;
  type pRVar10;
  int *piVar11;
  const_reference pvVar12;
  const_reference pvVar13;
  void *__s;
  pointer pSVar14;
  uchar **ppuVar15;
  const_reference pvVar16;
  mapped_type *pmVar17;
  undefined4 extraout_var;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  reallocate_function_ptr_t p_Var22;
  ulong uVar23;
  byte bVar24;
  size_t __n;
  uchar **__i;
  long lVar25;
  SortLayout *pSVar26;
  ulong uVar27;
  ulong uVar28;
  idx_t *count;
  data_ptr_t pdVar29;
  _func_int ***ppp_Var30;
  allocate_function_ptr_t l_ptr;
  allocate_function_ptr_t r_ptr;
  uchar **ppuVar31;
  idx_t iVar32;
  reallocate_function_ptr_t p_Var33;
  bool bVar34;
  idx_t sorting_size;
  int order;
  idx_t col_offset;
  data_ptr_t dataptr;
  idx_t row_width;
  value_type logical_type;
  data_ptr_t blob_row_ptr;
  BufferHandle handle;
  void *local_190;
  idx_t local_188;
  uchar **local_180;
  idx_t local_178;
  int local_16c;
  ulong local_168;
  ulong local_160;
  SortLayout *local_158;
  idx_t local_150;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> local_148;
  idx_t local_140;
  Allocator local_138;
  idx_t *local_118;
  void *local_110;
  AllocatedData local_108;
  const_reference pvStack_f0;
  idx_t *local_e8;
  LogicalType *pLStack_e0;
  type local_d8;
  BufferManager *local_d0;
  ulong local_c8;
  ulong local_c0;
  uchar **local_b8;
  LogicalType local_b0;
  RowLayout *local_98;
  vector<unsigned_long,_true> *local_90;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_88;
  vector<duckdb::OrderType,_true> *local_80;
  allocate_function_ptr_t local_78;
  long local_70;
  allocate_function_ptr_t local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::back(&this->sorted_blocks);
  local_d8 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator*(this_00);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&local_d8->radix_sorting_data);
  pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator*(pvVar9);
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_60,this->buffer_manager,pRVar10);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_60.node);
  count = &pRVar10->count;
  local_148._M_head_impl = (PrivateAllocatorData *)(local_60.node.ptr)->buffer;
  if (*count != 0) {
    piVar11 = (int *)((long)&(local_148._M_head_impl)->_vptr_PrivateAllocatorData +
                     this->sort_layout->comparison_size);
    uVar28 = 0;
    do {
      *piVar11 = (int)uVar28;
      piVar11 = (int *)((long)piVar11 + this->sort_layout->entry_size);
      uVar28 = (ulong)((int)uVar28 + 1);
    } while (uVar28 < *count);
  }
  local_178 = 0;
  local_150 = 0;
  local_188 = 0;
  pSVar26 = this->sort_layout;
  local_190 = (void *)0x0;
  if (pSVar26->column_count != 0) {
    local_d8 = (type)&local_d8->blob_sorting_data;
    bVar34 = false;
    __s = (void *)0x0;
    local_190 = (void *)0x0;
    local_138.free_function = (free_function_ptr_t)this;
    local_118 = count;
    do {
      pvVar12 = vector<unsigned_long,_true>::operator[](&pSVar26->column_sizes,local_188);
      local_178 = local_178 + *pvVar12;
      bVar4 = !bVar34;
      bVar34 = true;
      if (bVar4) {
        pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                            (&this->sort_layout->logical_types,local_188);
        bVar34 = pvVar13->physical_type_ == VARCHAR;
      }
      cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_188);
      _Var5._M_head_impl = local_148._M_head_impl;
      if ((!cVar6) || (this->sort_layout->column_count - 1 <= local_188)) {
        buffer_manager = this->buffer_manager;
        if (__s == (void *)0x0) {
          RadixSort(buffer_manager,(data_ptr_t *)&local_148,count,&local_150,&local_178,
                    this->sort_layout,bVar34);
          __s = operator_new__(*count);
          if (local_190 != (void *)0x0) {
            operator_delete__(local_190);
          }
          iVar32 = *count;
          __n = iVar32 - 1;
          if (__n != 0) {
            switchD_0105b559::default(__s,1,__n);
          }
          *(undefined1 *)((long)__s + (iVar32 - 1)) = 0;
          this = (LocalSortState *)local_138.free_function;
          local_190 = __s;
        }
        else {
          iVar32 = *count;
          if (iVar32 != 0) {
            pSVar26 = this->sort_layout;
            uVar28 = 0;
            do {
              if (*(char *)((long)__s + uVar28) == '\x01') {
                uVar23 = uVar28 + 1;
                if (uVar28 + 1 < iVar32) {
                  uVar23 = iVar32;
                }
                uVar21 = uVar28;
                do {
                  uVar19 = uVar23 - 1;
                  uVar27 = uVar23;
                  if (uVar23 - 1 == uVar21) break;
                  uVar27 = uVar21 + 1;
                  lVar20 = uVar21 + 1;
                  uVar19 = uVar21;
                  uVar21 = uVar27;
                } while (*(char *)((long)__s + lVar20) != '\0');
                local_108.allocator.ptr =
                     (Allocator *)
                     ((long)&(_Var5._M_head_impl)->_vptr_PrivateAllocatorData +
                     uVar28 * pSVar26->entry_size);
                local_b0._0_8_ = (uVar19 - uVar28) + 2;
                RadixSort(buffer_manager,(data_ptr_t *)&local_108,(idx_t *)&local_b0,&local_150,
                          &local_178,pSVar26,bVar34);
                uVar28 = uVar27;
              }
              uVar28 = uVar28 + 1;
              iVar32 = *local_118;
              this = (LocalSortState *)local_138.free_function;
              count = local_118;
            } while (uVar28 < iVar32);
          }
        }
        cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_188);
        if ((cVar6) && (local_188 == this->sort_layout->column_count - 1)) break;
        local_110 = __s;
        if (*count != 1) {
          pSVar26 = this->sort_layout;
          pdVar29 = (data_ptr_t)
                    ((long)&(local_148._M_head_impl)->_vptr_PrivateAllocatorData + local_150);
          uVar28 = 0;
          do {
            if (*(char *)((long)local_110 + uVar28) == '\x01') {
              iVar7 = FastMemcmp(pdVar29,pdVar29 + pSVar26->entry_size,local_178);
              bVar34 = iVar7 == 0;
            }
            else {
              bVar34 = false;
            }
            *(bool *)((long)local_110 + uVar28) = bVar34;
            pdVar29 = pdVar29 + pSVar26->entry_size;
            uVar28 = uVar28 + 1;
          } while (uVar28 < *count - 1);
        }
        __s = local_110;
        if (*count == 1) break;
        lVar20 = 0;
        bVar24 = 0;
        do {
          bVar3 = bVar24 & 1;
          bVar24 = 1;
          if (bVar3 == 0) {
            bVar24 = *(byte *)((long)local_110 + lVar20);
          }
          lVar20 = lVar20 + 1;
        } while (*count - 1 != lVar20);
        if (bVar24 == 0) break;
        cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_188);
        if (!cVar6) {
          local_d0 = this->buffer_manager;
          pSVar26 = this->sort_layout;
          local_138.private_data.
          super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
          .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl =
               (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                )(unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                  )local_148._M_head_impl;
          pSVar14 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                    operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                                *)local_d8);
          pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::back(&pSVar14->data_blocks);
          pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator*(pvVar9);
          (*local_d0->_vptr_BufferManager[7])(&local_48,local_d0,pRVar10);
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
          uVar28 = *count;
          if (uVar28 != 0) {
            local_78 = (allocate_function_ptr_t)(local_48.node.ptr)->buffer;
            local_98 = &pSVar26->blob_layout;
            local_80 = &pSVar26->order_types;
            local_88 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&pSVar26->sorting_to_blob_col;
            local_90 = &(pSVar26->blob_layout).offsets;
            uVar23 = 0;
            local_158 = pSVar26;
            do {
              if (*(char *)((long)__s + uVar23) == '\x01') {
                uVar21 = uVar23 + 1;
                if (uVar23 + 1 < uVar28) {
                  uVar21 = uVar28;
                }
                local_70 = (long)__s + uVar23;
                local_c0 = uVar23;
                do {
                  uVar28 = local_c0;
                  local_168 = uVar21 - 1;
                  local_c0 = uVar21;
                  if (uVar21 - 1 == uVar28) break;
                  local_c0 = uVar28 + 1;
                  local_168 = uVar28;
                } while (*(char *)((long)__s + uVar28 + 1) != '\0');
                local_138.allocate_function = local_78;
                local_140 = (pSVar26->blob_layout).row_width;
                ppp_Var30 = (_func_int ***)
                            ((long)(_func_int ***)
                                   local_138.private_data.
                                   super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                   .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                                   _M_head_impl + pSVar26->entry_size * uVar23);
                local_68 = local_78 +
                           *(uint *)((long)ppp_Var30 + pSVar26->comparison_size) * local_140;
                local_160 = uVar23;
                bVar34 = Comparators::TieIsBreakable(&local_188,(data_ptr_t *)&local_68,pSVar26);
                uVar23 = local_c0;
                if (bVar34) {
                  uVar28 = local_168 + 2;
                  p_Var22 = (reallocate_function_ptr_t)(uVar28 - local_160);
                  uVar23 = (long)p_Var22 * 8;
                  local_138.reallocate_function = p_Var22;
                  ppuVar15 = (uchar **)
                             operator_new__(-(ulong)((ulong)p_Var22 >> 0x3d != 0) | uVar23);
                  if (local_160 < uVar28) {
                    iVar32 = pSVar26->entry_size;
                    lVar20 = 0;
                    do {
                      ppuVar15[lVar20] = (uchar *)ppp_Var30;
                      ppp_Var30 = (_func_int ***)((long)ppp_Var30 + iVar32);
                      lVar20 = lVar20 + 1;
                    } while ((local_168 - local_160) + 2 != lVar20);
                  }
                  pvVar16 = vector<duckdb::OrderType,_true>::operator[](local_80,local_188);
                  local_16c = ((*pvVar16 != DESCENDING) - 1) + (uint)(*pvVar16 != DESCENDING);
                  local_c8 = uVar28;
                  pmVar17 = ::std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::at(local_88,&local_188);
                  pvVar12 = vector<unsigned_long,_true>::operator[](local_90,*pmVar17);
                  local_180 = ppuVar15;
                  pvVar13 = vector<duckdb::LogicalType,_true>::operator[](&local_98->types,*pmVar17)
                  ;
                  LogicalType::LogicalType(&local_b0,pvVar13);
                  local_108.allocator.ptr = &local_138;
                  local_108.pointer = (data_ptr_t)&local_16c;
                  local_e8 = &local_140;
                  local_108.allocated_size = (idx_t)pSVar26;
                  pvStack_f0 = pvVar12;
                  pLStack_e0 = &local_b0;
                  if (uVar23 != 0) {
                    local_b8 = local_180 + (long)p_Var22;
                    lVar20 = 0x3f;
                    if ((long)uVar23 >> 3 != 0) {
                      for (; (ulong)((long)uVar23 >> 3) >> lVar20 == 0; lVar20 = lVar20 + -1) {
                      }
                    }
                    __comp._M_comp.order = (int *)local_108.pointer;
                    __comp._M_comp.blob_ptr = (data_ptr_t *)local_108.allocator.ptr;
                    __comp._M_comp.sort_layout = pSVar26;
                    __comp._M_comp.tie_col_offset = pvVar12;
                    __comp._M_comp.row_width = local_e8;
                    __comp._M_comp.logical_type = &local_b0;
                    ::std::
                    __introsort_loop<unsigned_char**,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                              (local_180,local_b8,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,__comp);
                    if ((long)uVar23 < 0x81) {
                      __comp_01._M_comp.order = (int *)local_108.pointer;
                      __comp_01._M_comp.blob_ptr = (data_ptr_t *)local_108.allocator.ptr;
                      __comp_01._M_comp.sort_layout = (SortLayout *)local_108.allocated_size;
                      __comp_01._M_comp.tie_col_offset = pvStack_f0;
                      __comp_01._M_comp.row_width = local_e8;
                      __comp_01._M_comp.logical_type = pLStack_e0;
                      ::std::
                      __insertion_sort<unsigned_char**,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                                (local_180,local_b8,__comp_01);
                    }
                    else {
                      ppuVar15 = local_180 + 0x10;
                      __comp_00._M_comp.order = (int *)local_108.pointer;
                      __comp_00._M_comp.blob_ptr = (data_ptr_t *)local_108.allocator.ptr;
                      __comp_00._M_comp.sort_layout = (SortLayout *)local_108.allocated_size;
                      __comp_00._M_comp.tie_col_offset = pvStack_f0;
                      __comp_00._M_comp.row_width = local_e8;
                      __comp_00._M_comp.logical_type = pLStack_e0;
                      ::std::
                      __insertion_sort<unsigned_char**,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                                (local_180,ppuVar15,__comp_00);
                      do {
                        puVar1 = *ppuVar15;
                        ppuVar31 = ppuVar15;
                        while (iVar7 = local_16c,
                              iVar8 = Comparators::CompareVal
                                                ((data_ptr_t)
                                                 (local_138.allocate_function +
                                                 *(uint *)(puVar1 + pSVar26->comparison_size) *
                                                 local_140 + *pvVar12),
                                                 (data_ptr_t)
                                                 (local_138.allocate_function +
                                                 *(uint *)(ppuVar31[-1] + pSVar26->comparison_size)
                                                 * local_140 + *pvVar12),&local_b0),
                              iVar8 * iVar7 < 0) {
                          *ppuVar31 = ppuVar31[-1];
                          ppuVar31 = ppuVar31 + -1;
                        }
                        *ppuVar31 = puVar1;
                        ppuVar15 = ppuVar15 + 1;
                      } while (ppuVar15 != local_b8);
                    }
                  }
                  iVar7 = (*local_d0->_vptr_BufferManager[0x14])();
                  iVar32 = pSVar26->entry_size * (long)local_138.reallocate_function;
                  pdVar29 = Allocator::AllocateData
                                      ((Allocator *)CONCAT44(extraout_var,iVar7),iVar32);
                  AllocatedData::AllocatedData
                            (&local_108,(Allocator *)CONCAT44(extraout_var,iVar7),pdVar29,iVar32);
                  uVar28 = local_160;
                  if (local_c8 != local_160) {
                    p_Var22 = local_138.reallocate_function +
                              (local_138.reallocate_function == (reallocate_function_ptr_t)0x0);
                    p_Var33 = (reallocate_function_ptr_t)0x0;
                    piVar11 = (int *)local_108.pointer;
                    do {
                      FastMemcpy(piVar11,local_180[(long)p_Var33],pSVar26->entry_size);
                      piVar11 = (int *)((long)piVar11 + pSVar26->entry_size);
                      p_Var33 = p_Var33 + 1;
                    } while (p_Var22 != p_Var33);
                  }
                  switchD_015ff80e::default
                            ((_func_int ***)
                             ((long)(_func_int ***)
                                    local_138.private_data.
                                    super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                    .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                                    _M_head_impl + pSVar26->entry_size * uVar28),local_108.pointer,
                             (long)local_138.reallocate_function * pSVar26->entry_size);
                  if ((local_168 + 1 != uVar28) && (local_188 < local_158->column_count - 1)) {
                    lVar18 = local_158->entry_size * uVar28;
                    pdVar29 = (data_ptr_t)
                              ((long)local_138.private_data.
                                     super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                     .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                                     _M_head_impl + local_158->comparison_size + lVar18);
                    lVar20 = local_c8 + ~uVar28;
                    lVar2 = ~uVar28 + local_c8;
                    lVar25 = 0;
                    l_ptr = local_138.allocate_function +
                            *pvVar12 +
                            *(uint *)((long)local_138.private_data.
                                            super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                            ._M_t.
                                            super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                            .
                                            super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>
                                            ._M_head_impl + local_158->comparison_size + lVar18) *
                            local_140;
                    do {
                      iVar32 = local_158->entry_size;
                      r_ptr = local_138.allocate_function +
                              *pvVar12 + *(uint *)(pdVar29 + iVar32) * local_140;
                      iVar7 = Comparators::CompareVal((data_ptr_t)l_ptr,(data_ptr_t)r_ptr,&local_b0)
                      ;
                      pdVar29 = pdVar29 + iVar32;
                      *(bool *)(local_70 + lVar25) = iVar7 == 0;
                      lVar25 = lVar25 + 1;
                      l_ptr = r_ptr;
                    } while (lVar2 + (ulong)(lVar20 == 0) != lVar25);
                  }
                  AllocatedData::~AllocatedData(&local_108);
                  LogicalType::~LogicalType(&local_b0);
                  operator_delete__(local_180);
                  uVar23 = local_c0;
                  this = (LocalSortState *)local_138.free_function;
                  pSVar26 = local_158;
                  __s = local_110;
                  count = local_118;
                }
              }
              uVar23 = uVar23 + 1;
              uVar28 = *count;
            } while (uVar23 < uVar28);
          }
          BufferHandle::~BufferHandle(&local_48);
          if (*count == 1) break;
          lVar20 = 0;
          bVar24 = 0;
          do {
            bVar3 = bVar24 & 1;
            bVar24 = 1;
            if (bVar3 == 0) {
              bVar24 = *(byte *)((long)__s + lVar20);
            }
            lVar20 = lVar20 + 1;
          } while (*count - 1 != lVar20);
          if (bVar24 == 0) break;
        }
        local_150 = local_150 + local_178;
        local_178 = 0;
        bVar34 = false;
      }
      local_188 = local_188 + 1;
      pSVar26 = this->sort_layout;
    } while (local_188 < pSVar26->column_count);
  }
  if (local_190 != (void *)0x0) {
    operator_delete__(local_190);
  }
  BufferHandle::~BufferHandle(&local_60);
  return;
}

Assistant:

void LocalSortState::SortInMemory() {
	auto &sb = *sorted_blocks.back();
	auto &block = *sb.radix_sorting_data.back();
	const auto &count = block.count;
	auto handle = buffer_manager->Pin(block.block);
	const auto dataptr = handle.Ptr();
	// Assign an index to each row
	data_ptr_t idx_dataptr = dataptr + sort_layout->comparison_size;
	for (uint32_t i = 0; i < count; i++) {
		Store<uint32_t>(i, idx_dataptr);
		idx_dataptr += sort_layout->entry_size;
	}
	// Radix sort and break ties until no more ties, or until all columns are sorted
	idx_t sorting_size = 0;
	idx_t col_offset = 0;
	unsafe_unique_array<bool> ties_ptr;
	bool *ties = nullptr;
	bool contains_string = false;
	for (idx_t i = 0; i < sort_layout->column_count; i++) {
		sorting_size += sort_layout->column_sizes[i];
		contains_string = contains_string || sort_layout->logical_types[i].InternalType() == PhysicalType::VARCHAR;
		if (sort_layout->constant_size[i] && i < sort_layout->column_count - 1) {
			// Add columns to the sorting size until we reach a variable size column, or the last column
			continue;
		}

		if (!ties) {
			// This is the first sort
			RadixSort(*buffer_manager, dataptr, count, col_offset, sorting_size, *sort_layout, contains_string);
			ties_ptr = make_unsafe_uniq_array_uninitialized<bool>(count);
			ties = ties_ptr.get();
			std::fill_n(ties, count - 1, true);
			ties[count - 1] = false;
		} else {
			// For subsequent sorts, we only have to subsort the tied tuples
			SubSortTiedTuples(*buffer_manager, dataptr, count, col_offset, sorting_size, ties, *sort_layout,
			                  contains_string);
		}

		contains_string = false;

		if (sort_layout->constant_size[i] && i == sort_layout->column_count - 1) {
			// All columns are sorted, no ties to break because last column is constant size
			break;
		}

		ComputeTies(dataptr, count, col_offset, sorting_size, ties, *sort_layout);
		if (!AnyTies(ties, count)) {
			// No ties, stop sorting
			break;
		}

		if (!sort_layout->constant_size[i]) {
			SortTiedBlobs(*buffer_manager, sb, ties, dataptr, count, i, *sort_layout);
			if (!AnyTies(ties, count)) {
				// No more ties after tie-breaking, stop
				break;
			}
		}

		col_offset += sorting_size;
		sorting_size = 0;
	}
}